

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar10 = mouse_pos.x;
  if ((tab_bar->Flags & 1) != 0) {
    fVar11 = 0.0;
    if ((src_tab->Flags & 0xc0U) == 0) {
      fVar11 = tab_bar->ScrollingTarget;
    }
    fVar11 = (tab_bar->BarRect).Min.x - fVar11;
    fVar12 = src_tab->Offset + fVar11;
    pIVar4 = (tab_bar->Tabs).Data;
    iVar7 = (int)((ulong)((long)src_tab - (long)pIVar4) >> 3);
    uVar6 = iVar7 * -0x33333333;
    if (-1 < (int)uVar6) {
      uVar3 = (tab_bar->Tabs).Size;
      if (uVar3 != uVar6 && SBORROW4(uVar3,uVar6) == (int)(uVar3 + iVar7 * 0x33333333) < 0) {
        iVar9 = (uint)(fVar12 <= fVar10) * 2 + -1;
        uVar8 = uVar6;
        do {
          if (((pIVar4[uVar8].Flags & 0x20U) != 0) ||
             (((pIVar4[uVar8].Flags ^ src_tab->Flags) & 0xc0U) != 0)) goto LAB_00154ab4;
          fVar13 = pIVar4[uVar8].Offset + fVar11;
          fVar2 = (GImGui->Style).ItemInnerSpacing.x;
          bVar5 = pIVar4[uVar8].Width + fVar13 + fVar2 <= fVar10;
          if (fVar10 < fVar12) {
            bVar5 = fVar10 <= fVar13 - fVar2;
          }
          uVar1 = uVar8 + iVar9;
        } while (((bVar5) && (-1 < (int)uVar1)) &&
                (uVar6 = uVar8, uVar8 = uVar1, (int)uVar1 < (int)uVar3));
        uVar6 = uVar1 - iVar9;
      }
LAB_00154ab4:
      iVar7 = uVar6 + iVar7 * 0x33333333;
      if (iVar7 != 0) {
        tab_bar->ReorderRequestTabId = src_tab->ID;
        tab_bar->ReorderRequestOffset = (ImS16)iVar7;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}